

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O1

bool __thiscall SQInstance::Set(SQInstance *this,SQObjectPtr *key,SQObjectPtr *val)

{
  long *plVar1;
  uint uVar2;
  SQObjectType SVar3;
  long *plVar4;
  bool bVar5;
  ulong uVar6;
  SQObjectPtr idx;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_20.super_SQObject._type = OT_NULL;
  bVar5 = SQTable::Get(this->_class->_members,key,&local_20);
  if ((bVar5) && ((local_20.super_SQObject._unVal._0_4_ >> 0x19 & 1) != 0)) {
    uVar6 = (ulong)((local_20.super_SQObject._unVal._0_4_ & 0xffffff) << 4);
    uVar2 = *(uint *)((long)&this->_values[0].super_SQObject._type + uVar6);
    plVar4 = *(long **)((long)&this->_values[0].super_SQObject._unVal + uVar6);
    *(SQObjectValue *)((long)&this->_values[0].super_SQObject._unVal + uVar6) =
         (val->super_SQObject)._unVal;
    SVar3 = (val->super_SQObject)._type;
    *(SQObjectType *)((long)&this->_values[0].super_SQObject._type + uVar6) = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      plVar1 = (long *)(*(long *)((long)&this->_values[0].super_SQObject._unVal + uVar6) + 8);
      *plVar1 = *plVar1 + 1;
    }
    bVar5 = true;
    if ((uVar2 >> 0x1b & 1) != 0) {
      plVar1 = plVar4 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*plVar4 + 0x10))();
      }
    }
  }
  else {
    bVar5 = false;
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return bVar5;
}

Assistant:

bool Set(const SQObjectPtr &key,const SQObjectPtr &val) {
        SQObjectPtr idx;
        if(_class->_members->Get(key,idx) && _isfield(idx)) {
            _values[_member_idx(idx)] = val;
            return true;
        }
        return false;
    }